

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig
          (BinaryReaderObjdumpDisassemble *this,Type sig_type)

{
  size_t data_size;
  Enum EVar1;
  undefined8 uVar2;
  BinaryReaderObjdumpDisassemble local_40 [32];
  size_t local_20;
  Offset immediate_len;
  BinaryReaderObjdumpDisassemble *this_local;
  Type sig_type_local;
  
  local_20 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate
             .state)->offset - this->current_opcode_offset;
  immediate_len = (Offset)this;
  this_local._0_4_ = sig_type.enum_;
  EVar1 = Type::operator_cast_to_Enum((Type *)&this_local);
  data_size = local_20;
  if (EVar1 == Void) {
    LogOpcode(this,local_20,(char *)0x0);
  }
  else {
    (anonymous_namespace)::BinaryReaderObjdumpDisassemble::BlockSigToString_abi_cxx11_
              (local_40,(Type)(Enum)this);
    uVar2 = std::__cxx11::string::c_str();
    LogOpcode(this,data_size,"%s",uVar2);
    std::__cxx11::string::~string((string *)local_40);
  }
  this->indent_level = this->indent_level + 1;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeBlockSig(Type sig_type) {
  Offset immediate_len = state->offset - current_opcode_offset;
  if (sig_type != Type::Void) {
    LogOpcode(immediate_len, "%s", BlockSigToString(sig_type).c_str());
  } else {
    LogOpcode(immediate_len, nullptr);
  }
  indent_level++;
  return Result::Ok;
}